

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

bool __thiscall MultivariateTracker::update(MultivariateTracker *this,DataVector *data)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pSVar9;
  ulong uVar10;
  pointer pDVar11;
  double *pdVar12;
  pointer this_00;
  double dVar13;
  double dVar14;
  
  this_00 = (this->_statistics).
            super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar5 = (long)(this->_statistics).
                super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)this_00;
  if (lVar5 == 0) {
    lVar5 = (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar5 != 0) {
      initialize(this,lVar5 >> 4,&this->_options);
      pDVar11 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                super__Vector_impl_data._M_start;
      this_00 = (this->_statistics).
                super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                super__Vector_impl_data._M_start;
      goto LAB_001852a9;
    }
  }
  else {
    pDVar11 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
              super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
              super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pDVar11 >> 4 == lVar5 / 0xe8) {
LAB_001852a9:
      if ((this->_options).doCov != false) {
        uVar8 = (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                      super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pDVar11;
        uVar6 = uVar8 >> 4;
        iVar4 = (int)uVar6;
        lVar5 = 0;
        uVar7 = 0;
        if (0 < iVar4) {
          uVar7 = uVar6 & 0xffffffff;
        }
        for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
          if (pDVar11[uVar6].active == true) {
            dVar1 = pDVar11[uVar6].value;
            dVar2 = this_00[uVar6]._mean;
            dVar13 = (double)((int)this_00[uVar6]._count + 1);
            pdVar3 = (this->_covariance).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
            pSVar9 = this_00;
            for (uVar10 = 0; (uVar8 >> 1 & 0x7fffffff8) != uVar10; uVar10 = uVar10 + 8) {
              if ((&pDVar11->active)[uVar10 * 2] == true) {
                dVar14 = (double)((int)pSVar9->_count + 1);
                if (dVar14 <= dVar13) {
                  dVar14 = dVar13;
                }
                *(double *)((long)pdVar3 + uVar10 + lVar5) =
                     (((dVar14 + -1.0) / dVar14) * (dVar1 - dVar2) *
                      (*(double *)((long)&pDVar11->value + uVar10 * 2) - pSVar9->_mean) +
                     *(double *)((long)pdVar3 + uVar10 + lVar5) * (dVar14 + -1.0)) / dVar14;
              }
              pSVar9 = pSVar9 + 1;
            }
          }
          lVar5 = lVar5 + (long)iVar4 * 8;
        }
      }
      pdVar12 = &pDVar11->value;
      for (; this_00 !=
             (this->_statistics).
             super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
             super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
        if (((DataPoint *)(pdVar12 + -1))->active == true) {
          StatisticsTracker::update(this_00,*pdVar12);
        }
        pdVar12 = pdVar12 + 2;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
    update(DataVector const & data)
    {

        // Check data dimensions matches tracker dimensions
        if (this->_statistics.size() != 0 && data.size() != this->_statistics.size())
        {
            return false;
        }

        // Try to initialize the tracker
        if (this->_statistics.size() == 0)
        {
            if (data.size() == 0) return false;
            this->initialize(data.size(), this->_options);
        }

        if (this->_options.doCov)
        {

            // Update covariance
            const int numPoints = data.size();
            for (int i = 0; i < numPoints; i++)
            {
            
                if (!data[i].active) continue;

                int countI = this->_statistics[i].getCount();
                double meanI = this->_statistics[i].getMean();
                double deltaI = (data[i].value - meanI);

                for (int j = 0; j < numPoints; j++)
                {

                    if (!data[j].active) continue;
                
                    int countJ = this->_statistics[j].getCount();
                    double meanJ = this->_statistics[j].getMean();
                    double deltaJ = (data[j].value - meanJ);

                    // Conservative estimate the number of data points
                    double N = std::max<double>(countI+1, countJ+1);

                    int k = i * numPoints + j;
                    this->_covariance[k] *= (N-1);
                    this->_covariance[k] += ((N-1)/N) * (deltaI) * (deltaJ);
                    this->_covariance[k] /= N;

                }
            }

        }

        // Update statistics with each data point
        DataVector::const_iterator datum = data.begin();
        std::vector<StatisticsTracker>::iterator tracker = this->_statistics.begin();
        for ( ; tracker != this->_statistics.end(); ++tracker, ++datum)
        {
            if (datum->active) tracker->update(datum->value);
        }

        return true;
        
    }